

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>::
operator()(arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>
           *this,basic_string_view<wchar_t> value)

{
  buffer<wchar_t> *pbVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  wchar_t *data;
  str_writer<wchar_t> local_40;
  
  uVar4 = value.size_;
  if (this->specs_ == (format_specs *)0x0) {
    pbVar1 = (this->writer_).out_.container;
    sVar2 = pbVar1->size_;
    uVar3 = sVar2 + uVar4;
    if (pbVar1->capacity_ < uVar3) {
      (**pbVar1->_vptr_buffer)(pbVar1,uVar3);
    }
    pbVar1->size_ = uVar3;
    if (uVar4 != 0) {
      memmove(pbVar1->ptr_ + sVar2,value.data_,uVar4 << 2);
    }
  }
  else {
    check_string_type_spec<char,duckdb_fmt::v6::internal::error_handler>
              (this->specs_->type,(error_handler *)&local_40);
    uVar3 = (ulong)this->specs_->precision;
    local_40.size_ = uVar4;
    if (uVar3 < uVar4) {
      local_40.size_ = uVar3;
    }
    if ((long)uVar3 < 0) {
      local_40.size_ = uVar4;
    }
    local_40.s = value.data_;
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
    write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::str_writer<wchar_t>>
              ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this,this->specs_,&local_40);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }